

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexfloat.hpp
# Opt level: O0

void __thiscall
flexfloat<(unsigned_char)'\x03',_(unsigned_char)'\x03'>::flexfloat<double>
          (flexfloat<(unsigned_char)__x03_,_(unsigned_char)__x03_> *this,double *w)

{
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  flexfloat_t *in_stack_00000030;
  
  *in_RDI = *in_RSI;
  *(undefined1 *)(in_RDI + 1) = 3;
  *(undefined1 *)((long)in_RDI + 9) = 3;
  flexfloat_sanitize(in_stack_00000030);
  return;
}

Assistant:

INLINE flexfloat (const U &w)
    {
#ifdef FLEXFLOAT_STATS
        if(flexfloat_stats_enabled) {
            FlexfloatPrecision p = get_type_precision(w);
            if(flexfloat_vectorization) vcasting_stats[make_precision(p.first, p.second, exp_bits, frac_bits)].total++;
            else casting_stats[make_precision(p.first, p.second, exp_bits, frac_bits)].total++;
        }
#endif
        v.value = fp_t(w);
        v.desc.exp_bits = exp_bits;
        v.desc.frac_bits = frac_bits;

        flexfloat_sanitize(&v);
    }